

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

unsigned_long elf_numsegments(GlobalVars *gv)

{
  Phdr *p;
  int segcnt;
  GlobalVars *gv_local;
  
  segcnt = 0;
  for (p = gv->phdrlist; p != (Phdr *)0x0; p = p->next) {
    if ((p->flags & 0x10) != 0) {
      segcnt = segcnt + 1;
    }
  }
  return (long)segcnt;
}

Assistant:

unsigned long elf_numsegments(struct GlobalVars *gv)
{
  int segcnt = 0;
  struct Phdr *p = gv->phdrlist;

  while (p) {
    if (p->flags & PHDR_USED)
      segcnt++;
    p = p->next;
  }
  return segcnt;
}